

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u64 sqlite3Fts5IndexEntryCksum(i64 iRowid,int iCol,int iPos,int iIdx,char *pTerm,int nTerm)

{
  u64 local_38;
  u64 ret;
  int i;
  int nTerm_local;
  char *pTerm_local;
  int iIdx_local;
  int iPos_local;
  int iCol_local;
  i64 iRowid_local;
  
  local_38 = (iRowid * 9 + (long)iCol) * 9 + (long)iPos;
  if (-1 < iIdx) {
    local_38 = local_38 * 9 + (long)(iIdx + 0x30);
  }
  for (ret._0_4_ = 0; (int)ret < nTerm; ret._0_4_ = (int)ret + 1) {
    local_38 = local_38 * 9 + (long)pTerm[(int)ret];
  }
  return local_38;
}

Assistant:

static u64 sqlite3Fts5IndexEntryCksum(
  i64 iRowid, 
  int iCol, 
  int iPos, 
  int iIdx,
  const char *pTerm,
  int nTerm
){
  int i;
  u64 ret = iRowid;
  ret += (ret<<3) + iCol;
  ret += (ret<<3) + iPos;
  if( iIdx>=0 ) ret += (ret<<3) + (FTS5_MAIN_PREFIX + iIdx);
  for(i=0; i<nTerm; i++) ret += (ret<<3) + pTerm[i];
  return ret;
}